

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Segment::UpdateDocTypeVersion(Segment *this)

{
  uint32_t uVar1;
  Track *this_00;
  uint64_t uVar2;
  long in_RDI;
  Track *track;
  uint32_t index;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar1 = Tracks::track_entries_size((Tracks *)(in_RDI + 0x98));
    if (uVar1 <= local_c) {
      return;
    }
    this_00 = Tracks::GetTrackByIndex((Tracks *)(in_RDI + 0x98),local_c);
    if (this_00 == (Track *)0x0) break;
    uVar2 = Track::codec_delay(this_00);
    if (((uVar2 != 0) || (uVar2 = Track::seek_pre_roll(this_00), uVar2 != 0)) &&
       (*(uint *)(in_RDI + 0x968) < 4)) {
      *(undefined4 *)(in_RDI + 0x968) = 4;
      return;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void Segment::UpdateDocTypeVersion() {
  for (uint32_t index = 0; index < tracks_.track_entries_size(); ++index) {
    const Track* track = tracks_.GetTrackByIndex(index);
    if (track == NULL)
      break;
    if ((track->codec_delay() || track->seek_pre_roll()) &&
        doc_type_version_ < 4) {
      doc_type_version_ = 4;
      break;
    }
  }
}